

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugFrame::parse(DWARFDebugFrame *this,DWARFDataExtractor Data)

{
  undefined4 uVar1;
  CIE *pCVar2;
  DWARFDataExtractor Data_00;
  unkbyte9 Var3;
  byte bVar4;
  char cVar5;
  uint64_t uVar6;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar7;
  unsigned_long *puVar8;
  uint *puVar9;
  value_type *pvVar10;
  DWARFDebugFrame *pDVar11;
  uint64_t uVar12;
  OptionalStorage<unsigned_int,_true> OVar13;
  uint32_t byte_size;
  DWARFDebugFrame *pDVar14;
  Error *E;
  char *pcVar15;
  ulong uVar16;
  size_t Index;
  unsigned_long uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  Optional<unsigned_long> OVar22;
  undefined1 local_158 [8];
  DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  CIEs;
  uint64_t CodeAlignmentFactor;
  int64_t DataAlignmentFactor;
  uint64_t ReturnAddressRegister;
  DWARFDebugFrame *local_120;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_118;
  ulong local_110;
  undefined **local_108;
  uint64_t local_100;
  uint64_t local_f8;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_f0;
  char local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
  *local_d0;
  unsigned_long local_c8;
  uint64_t local_c0;
  uint64_t Length;
  uint64_t local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  StringRef AugmentationString;
  uint local_70;
  undefined1 local_6c [4];
  uint32_t FDEPointerEncoding;
  uint32_t LSDAPointerEncoding;
  Optional<unsigned_long> AugmentationLength;
  Optional<unsigned_int> PersonalityEncoding;
  uint64_t StartOffset;
  uint64_t Offset;
  uint8_t local_33;
  uint8_t local_32;
  byte local_31;
  uint8_t SegmentDescriptorSize;
  uint8_t AddressSize;
  uint8_t Version;
  
  StartOffset = 0;
  DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
  ::init((DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
          *)local_158,(EVP_PKEY_CTX *)0x0);
  local_d0 = (vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
              *)&this->Entries;
  local_108 = &PTR__FrameEntry_011281a8;
  OVar13.field_0 = (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)0x0;
  OVar13.hasVal = false;
  OVar13._5_3_ = 0;
  Offset = (uint64_t)this;
  do {
    if (Data.super_DataExtractor.Data.Length <= (ulong)OVar13) {
      DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
      ::~DenseMap((DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                   *)local_158);
      return;
    }
    Length = (uint64_t)this;
    PersonalityEncoding.Storage = OVar13;
    uVar6 = DWARFDataExtractor::getRelocatedValue(&Data,4,&StartOffset,(uint64_t *)0x0,(Error *)0x0)
    ;
    local_c0 = uVar6;
    if (uVar6 == 0xffffffff) {
      local_e0 = uVar6;
      local_c0 = DWARFDataExtractor::getRelocatedValue
                           (&Data,8,&StartOffset,(uint64_t *)0x0,(Error *)0x0);
    }
    local_d8 = StartOffset;
    byte_size = ((byte)~*(byte *)(Offset + 4) & 1) * 4 + 4;
    if (uVar6 != 0xffffffff) {
      byte_size = 4;
    }
    local_e0 = local_c0;
    aVar7.value = DataExtractor::getUnsigned
                            (&Data.super_DataExtractor,&StartOffset,byte_size,(Error *)0x0);
    if (((aVar7.value == 0xffffffff) || (aVar7.value == 0xffffffffffffffff && uVar6 == 0xffffffff))
       || (aVar7.value == 0 && *(char *)(Offset + 4) == '\x01')) {
      local_31 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
      local_98 = (undefined1  [8])DataExtractor::getCStr(&Data.super_DataExtractor,&StartOffset);
      if (local_98 == (undefined1  [8])0x0) {
        local_98 = (undefined1  [8])((long)"\n\r\t" + 3);
      }
      AugmentationString.Data = (char *)strlen((char *)local_98);
      this = (DWARFDebugFrame *)Length;
      if (local_31 < 4) {
        local_32 = Data.super_DataExtractor.AddressSize;
LAB_00d8a755:
        local_33 = '\0';
        Data.super_DataExtractor.AddressSize = local_32;
      }
      else {
        Data.super_DataExtractor.AddressSize =
             DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        local_32 = Data.super_DataExtractor.AddressSize;
        if (local_31 < 4) goto LAB_00d8a755;
        local_33 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
      }
      CIEs._16_8_ = DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
      CodeAlignmentFactor = DataExtractor::getSLEB128(&Data.super_DataExtractor,&StartOffset);
      if (local_31 == 1) {
        bVar4 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
        DataAlignmentFactor = (int64_t)bVar4;
      }
      else {
        DataAlignmentFactor =
             DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
      }
      local_a8._0_8_ = "";
      local_a8._8_8_ = (pointer)0x0;
      local_70 = 0;
      local_6c = (undefined1  [4])0xff;
      local_f0.value = local_f0.value & 0xffffffffffffff00;
      local_e8 = '\0';
      AugmentationLength.Storage._8_4_ = AugmentationLength.Storage._8_4_ & 0xffffff00;
      AugmentationLength.Storage._12_1_ = 0;
      if (*(char *)(Offset + 4) == '\x01') {
        _FDEPointerEncoding = _FDEPointerEncoding & 0xffffffffffffff00;
        AugmentationLength.Storage.field_0.empty = '\0';
        uVar16 = (ulong)AugmentationString.Data & 0xffffffff;
        for (Index = 0; uVar16 != Index; Index = Index + 1) {
          cVar5 = StringRef::operator[]((StringRef *)local_98,Index);
          switch(cVar5) {
          case 'L':
            bVar4 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
            local_6c = (undefined1  [4])(uint)bVar4;
            break;
          case 'M':
          case 'N':
          case 'O':
          case 'Q':
switchD_00d8a8eb_caseD_4d:
            pcVar15 = "Unknown augmentation character in entry at %lx";
LAB_00d8ad68:
            ReportError((uint64_t)PersonalityEncoding.Storage,pcVar15);
          case 'P':
            if (local_e8 != '\0') {
              pcVar15 = "Duplicate personality in entry at %lx";
              goto LAB_00d8ad68;
            }
            bVar4 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
            if (AugmentationLength.Storage._12_1_ == '\0') {
              AugmentationLength.Storage._12_1_ = 1;
            }
            AugmentationLength.Storage._8_4_ = ZEXT14(bVar4);
            puVar9 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue
                               ((OptionalStorage<unsigned_int,_true> *)
                                &AugmentationLength.Storage.hasVal);
            uVar6 = StartOffset + *(long *)(Offset + 8);
            if (*(long *)(Offset + 8) == 0) {
              uVar6 = 0;
            }
            OVar22 = DWARFDataExtractor::getEncodedPointer
                               (&Data,&StartOffset,(uint8_t)*puVar9,uVar6);
            local_f0 = OVar22.Storage.field_0;
            local_e8 = OVar22.Storage.hasVal;
            break;
          case 'R':
            bVar4 = DataExtractor::getU8(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
            local_70 = (uint)bVar4;
            break;
          case 'S':
            break;
          default:
            if (cVar5 != 'B') {
              if (cVar5 != 'z') goto switchD_00d8a8eb_caseD_4d;
              if (Index != 0) {
                pcVar15 = "\'z\' must be the first character at %lx";
                goto LAB_00d8ad68;
              }
              _FDEPointerEncoding =
                   DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
              uVar6 = StartOffset;
              if (AugmentationLength.Storage.field_0.empty == '\0') {
                AugmentationLength.Storage.field_0.empty = '\x01';
              }
              puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                                 ((OptionalStorage<unsigned_long,_true> *)&FDEPointerEncoding);
              local_120 = (DWARFDebugFrame *)uVar6;
              this = (DWARFDebugFrame *)(*puVar8 + uVar6);
            }
          }
        }
        if (AugmentationLength.Storage.field_0.empty != '\0') {
          if ((DWARFDebugFrame *)StartOffset != this) {
            ReportError((uint64_t)PersonalityEncoding.Storage,
                        "Parsing augmentation data at %lx failed");
          }
          pDVar11 = local_120;
          if (Data.super_DataExtractor.Data.Length < local_120) {
            pDVar11 = (DWARFDebugFrame *)Data.super_DataExtractor.Data.Length;
          }
          pDVar14 = this;
          if (this < pDVar11) {
            pDVar14 = pDVar11;
          }
          if (Data.super_DataExtractor.Data.Length < this) {
            pDVar14 = (DWARFDebugFrame *)Data.super_DataExtractor.Data.Length;
          }
          local_a8._8_8_ = (long)pDVar14 - (long)pDVar11;
          local_a8._0_8_ = Data.super_DataExtractor.Data.Data + (long)&pDVar11->Arch;
        }
      }
      std::
      make_unique<llvm::dwarf::CIE,unsigned_long&,unsigned_long&,unsigned_char&,llvm::StringRef&,unsigned_char&,unsigned_char&,unsigned_long&,long&,unsigned_long&,llvm::StringRef&,unsigned_int&,unsigned_int&,llvm::Optional<unsigned_long>&,llvm::Optional<unsigned_int>&,llvm::Triple::ArchType_const&>
                ((unsigned_long *)&FDEPointerEncoding,(unsigned_long *)&PersonalityEncoding,
                 (uchar *)&local_c0,(StringRef *)&local_31,local_98,&local_32,
                 (unsigned_long *)&local_33,(long *)&CIEs.NumBuckets,&CodeAlignmentFactor,
                 (StringRef *)&DataAlignmentFactor,(uint *)local_a8,&local_70,
                 (Optional<unsigned_long> *)local_6c,(Optional<unsigned_int> *)&local_f0,
                 (ArchType *)&AugmentationLength.Storage.hasVal);
      aVar7 = _FDEPointerEncoding;
      pvVar10 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                    *)local_158,(unsigned_long *)&PersonalityEncoding);
      (pvVar10->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second = (CIE *)aVar7;
      std::
      vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
      ::emplace_back<std::unique_ptr<llvm::dwarf::CIE,std::default_delete<llvm::dwarf::CIE>>>
                (local_d0,(unique_ptr<llvm::dwarf::CIE,_std::default_delete<llvm::dwarf::CIE>_> *)
                          &FDEPointerEncoding);
      if ((CIE *)_FDEPointerEncoding != (CIE *)0x0) {
        (**(code **)(*(long *)_FDEPointerEncoding + 8))();
      }
    }
    else {
      local_98 = (undefined1  [8])(local_d8 - aVar7.value);
      if (*(char *)(Offset + 4) == '\0') {
        local_98 = (undefined1  [8])aVar7.value;
      }
      local_118.value = aVar7.value;
      pvVar10 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                ::FindAndConstruct((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>,_unsigned_long,_llvm::dwarf::CIE_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_llvm::dwarf::CIE_*>_>
                                    *)local_158,(unsigned_long *)local_98);
      this = (DWARFDebugFrame *)Length;
      pCVar2 = (pvVar10->super_pair<unsigned_long,_llvm::dwarf::CIE_*>).second;
      if (*(char *)(Offset + 4) == '\x01') {
        if (pCVar2 == (CIE *)0x0) {
          ReportError((uint64_t)PersonalityEncoding.Storage,
                      "Parsing FDE data at %lx failed due to missing CIE");
        }
        uVar6 = StartOffset + *(long *)(Offset + 8);
        if (*(long *)(Offset + 8) == 0) {
          uVar6 = 0;
        }
        OVar22 = DWARFDataExtractor::getEncodedPointer
                           (&Data,&StartOffset,(uint8_t)pCVar2->FDEPointerEncoding,uVar6);
        local_98 = (undefined1  [8])OVar22.Storage.field_0;
        AugmentationString.Data =
             (char *)CONCAT71(AugmentationString.Data._1_7_,OVar22.Storage.hasVal);
        if (((undefined1  [16])OVar22.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          uVar17 = 0;
        }
        else {
          puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)local_98);
          uVar17 = *puVar8;
        }
        OVar22 = DWARFDataExtractor::getEncodedPointer
                           (&Data,&StartOffset,(uint8_t)pCVar2->FDEPointerEncoding,0);
        local_98 = (undefined1  [8])OVar22.Storage.field_0;
        AugmentationString.Data =
             (char *)CONCAT71(AugmentationString.Data._1_7_,OVar22.Storage.hasVal);
        if (((undefined1  [16])OVar22.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_b0 = 0;
        }
        else {
          puVar8 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                             ((OptionalStorage<unsigned_long,_true> *)local_98);
          local_b0 = *puVar8;
        }
        local_c8 = uVar17;
        if ((pCVar2->Augmentation).super_SmallVector<char,_8U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size == 0) {
          Var3 = SUB169(ZEXT816(0),0);
        }
        else {
          uVar6 = DataExtractor::getULEB128(&Data.super_DataExtractor,&StartOffset,(Error *)0x0);
          if (pCVar2->LSDAPointerEncoding == 0xff) {
            Var3 = SUB169(ZEXT816(0),0);
            uVar12 = StartOffset;
          }
          else {
            local_f8 = StartOffset;
            uVar12 = *(long *)(Offset + 8) + StartOffset;
            if (*(long *)(Offset + 8) == 0) {
              uVar12 = 0;
            }
            local_100 = uVar6;
            OVar22 = DWARFDataExtractor::getEncodedPointer
                               (&Data,&StartOffset,(uint8_t)pCVar2->LSDAPointerEncoding,uVar12);
            Var3 = OVar22.Storage._0_9_;
            local_110 = OVar22.Storage.field_0.value >> 8;
            uVar6 = local_100;
            uVar12 = local_f8;
          }
          if (StartOffset != uVar12 + uVar6) {
            ReportError((uint64_t)PersonalityEncoding.Storage,
                        "Parsing augmentation data at %lx failed");
          }
        }
      }
      else {
        local_c8 = DWARFDataExtractor::getRelocatedAddress(&Data,&StartOffset,(uint64_t *)0x0);
        this = (DWARFDebugFrame *)Length;
        local_b0 = DWARFDataExtractor::getRelocatedAddress(&Data,&StartOffset,(uint64_t *)0x0);
        Var3 = SUB169(ZEXT816(0),0);
      }
      local_98 = (undefined1  [8])operator_new(0x80);
      if (pCVar2 == (CIE *)0x0) {
        uVar18 = 0;
        uVar19 = 0;
        uVar20 = 0;
        uVar21 = 0;
      }
      else {
        uVar18 = (undefined4)pCVar2->CodeAlignmentFactor;
        uVar19 = *(undefined4 *)((long)&pCVar2->CodeAlignmentFactor + 4);
        uVar20 = (undefined4)pCVar2->DataAlignmentFactor;
        uVar21 = *(undefined4 *)((long)&pCVar2->DataAlignmentFactor + 4);
      }
      uVar1 = *(undefined4 *)Offset;
      pcVar15 = (char *)((long)local_98 + 8);
      pcVar15[0] = '\x01';
      pcVar15[1] = '\0';
      pcVar15[2] = '\0';
      pcVar15[3] = '\0';
      *(OptionalStorage<unsigned_int,_true> *)((long)local_98 + 0x10) = PersonalityEncoding.Storage;
      *(uint64_t *)((long)local_98 + 0x18) = local_c0;
      pcVar15 = (char *)((long)local_98 + 0x30);
      pcVar15[0] = '\0';
      pcVar15[1] = '\0';
      pcVar15[2] = '\0';
      pcVar15[3] = '\0';
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      pcVar15 = (char *)((long)local_98 + 0x20);
      pcVar15[0] = '\0';
      pcVar15[1] = '\0';
      pcVar15[2] = '\0';
      pcVar15[3] = '\0';
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      pcVar15 = (char *)((long)local_98 + 0x28);
      pcVar15[0] = '\0';
      pcVar15[1] = '\0';
      pcVar15[2] = '\0';
      pcVar15[3] = '\0';
      pcVar15[4] = '\0';
      pcVar15[5] = '\0';
      pcVar15[6] = '\0';
      pcVar15[7] = '\0';
      *(undefined4 *)((long)local_98 + 0x38) = uVar18;
      *(undefined4 *)((long)local_98 + 0x3c) = uVar19;
      *(undefined4 *)((long)local_98 + 0x40) = uVar20;
      *(undefined4 *)((long)local_98 + 0x44) = uVar21;
      *(undefined4 *)((long)local_98 + 0x48) = uVar1;
      *(undefined ***)local_98 = local_108;
      *(anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 *)((long)local_98 + 0x50)
           = local_118;
      *(unsigned_long *)((long)local_98 + 0x58) = local_c8;
      *(uint64_t *)((long)local_98 + 0x60) = local_b0;
      *(CIE **)((long)local_98 + 0x68) = pCVar2;
      *(ulong *)((long)local_98 + 0x70) = (ulong)Var3 & 0xff | local_110 << 8;
      *(char *)((long)local_98 + 0x78) = (char)((unkuint9)Var3 >> 0x40);
      std::
      vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>
      ::emplace_back<llvm::dwarf::FDE*>(local_d0,(FDE **)local_98);
    }
    OVar13 = (OptionalStorage<unsigned_int,_true>)(local_e0 + local_d8);
    Data_00.super_DataExtractor.AddressSize = Data.super_DataExtractor.AddressSize;
    Data_00.super_DataExtractor.IsLittleEndian = Data.super_DataExtractor.IsLittleEndian;
    Data_00.super_DataExtractor._18_6_ = Data.super_DataExtractor._18_6_;
    Data_00.super_DataExtractor.Data.Length = Data.super_DataExtractor.Data.Length;
    Data_00.super_DataExtractor.Data.Data = Data.super_DataExtractor.Data.Data;
    Data_00.Obj = Data.Obj;
    Data_00.Section = Data.Section;
    dwarf::CFIProgram::parse
              ((CFIProgram *)local_a8,Data_00,
               (uint64_t *)(*(long *)(*(long *)(Offset + 0x18) + -8) + 0x20),(uint64_t)&StartOffset)
    ;
    if ((pointer)0x1 < (ulong)local_a8._0_8_) {
      ReturnAddressRegister = local_a8._0_8_ | 1;
      local_a8._0_8_ = (pointer)0x0;
      toString_abi_cxx11_((string *)local_98,(llvm *)&ReturnAddressRegister,E);
      report_fatal_error((string *)local_98,true);
    }
    if ((OptionalStorage<unsigned_int,_true>)StartOffset != OVar13) {
      ReportError((uint64_t)PersonalityEncoding.Storage,"Parsing entry instructions at %lx failed");
    }
  } while( true );
}

Assistant:

void DWARFDebugFrame::parse(DWARFDataExtractor Data) {
  uint64_t Offset = 0;
  DenseMap<uint64_t, CIE *> CIEs;

  while (Data.isValidOffset(Offset)) {
    uint64_t StartOffset = Offset;

    bool IsDWARF64 = false;
    uint64_t Length = Data.getRelocatedValue(4, &Offset);
    uint64_t Id;

    if (Length == dwarf::DW_LENGTH_DWARF64) {
      // DWARF-64 is distinguished by the first 32 bits of the initial length
      // field being 0xffffffff. Then, the next 64 bits are the actual entry
      // length.
      IsDWARF64 = true;
      Length = Data.getRelocatedValue(8, &Offset);
    }

    // At this point, Offset points to the next field after Length.
    // Length is the structure size excluding itself. Compute an offset one
    // past the end of the structure (needed to know how many instructions to
    // read).
    uint64_t StartStructureOffset = Offset;
    uint64_t EndStructureOffset = Offset + Length;

    // The Id field's size depends on the DWARF format
    Id = Data.getUnsigned(&Offset, (IsDWARF64 && !IsEH) ? 8 : 4);
    bool IsCIE =
        ((IsDWARF64 && Id == DW64_CIE_ID) || Id == DW_CIE_ID || (IsEH && !Id));

    if (IsCIE) {
      uint8_t Version = Data.getU8(&Offset);
      const char *Augmentation = Data.getCStr(&Offset);
      StringRef AugmentationString(Augmentation ? Augmentation : "");
      uint8_t AddressSize = Version < 4 ? Data.getAddressSize() :
                                          Data.getU8(&Offset);
      Data.setAddressSize(AddressSize);
      uint8_t SegmentDescriptorSize = Version < 4 ? 0 : Data.getU8(&Offset);
      uint64_t CodeAlignmentFactor = Data.getULEB128(&Offset);
      int64_t DataAlignmentFactor = Data.getSLEB128(&Offset);
      uint64_t ReturnAddressRegister =
          Version == 1 ? Data.getU8(&Offset) : Data.getULEB128(&Offset);

      // Parse the augmentation data for EH CIEs
      StringRef AugmentationData("");
      uint32_t FDEPointerEncoding = DW_EH_PE_absptr;
      uint32_t LSDAPointerEncoding = DW_EH_PE_omit;
      Optional<uint64_t> Personality;
      Optional<uint32_t> PersonalityEncoding;
      if (IsEH) {
        Optional<uint64_t> AugmentationLength;
        uint64_t StartAugmentationOffset;
        uint64_t EndAugmentationOffset;

        // Walk the augmentation string to get all the augmentation data.
        for (unsigned i = 0, e = AugmentationString.size(); i != e; ++i) {
          switch (AugmentationString[i]) {
            default:
              ReportError(
                  StartOffset,
                  "Unknown augmentation character in entry at %" PRIx64);
            case 'L':
              LSDAPointerEncoding = Data.getU8(&Offset);
              break;
            case 'P': {
              if (Personality)
                ReportError(StartOffset,
                            "Duplicate personality in entry at %" PRIx64);
              PersonalityEncoding = Data.getU8(&Offset);
              Personality = Data.getEncodedPointer(
                  &Offset, *PersonalityEncoding,
                  EHFrameAddress ? EHFrameAddress + Offset : 0);
              break;
            }
            case 'R':
              FDEPointerEncoding = Data.getU8(&Offset);
              break;
            case 'S':
              // Current frame is a signal trampoline.
              break;
            case 'z':
              if (i)
                ReportError(StartOffset,
                            "'z' must be the first character at %" PRIx64);
              // Parse the augmentation length first.  We only parse it if
              // the string contains a 'z'.
              AugmentationLength = Data.getULEB128(&Offset);
              StartAugmentationOffset = Offset;
              EndAugmentationOffset = Offset + *AugmentationLength;
              break;
            case 'B':
              // B-Key is used for signing functions associated with this
              // augmentation string
              break;
          }
        }

        if (AugmentationLength.hasValue()) {
          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");

          AugmentationData = Data.getData().slice(StartAugmentationOffset,
                                                  EndAugmentationOffset);
        }
      }

      auto Cie = std::make_unique<CIE>(
          StartOffset, Length, Version, AugmentationString, AddressSize,
          SegmentDescriptorSize, CodeAlignmentFactor, DataAlignmentFactor,
          ReturnAddressRegister, AugmentationData, FDEPointerEncoding,
          LSDAPointerEncoding, Personality, PersonalityEncoding, Arch);
      CIEs[StartOffset] = Cie.get();
      Entries.emplace_back(std::move(Cie));
    } else {
      // FDE
      uint64_t CIEPointer = Id;
      uint64_t InitialLocation = 0;
      uint64_t AddressRange = 0;
      Optional<uint64_t> LSDAAddress;
      CIE *Cie = CIEs[IsEH ? (StartStructureOffset - CIEPointer) : CIEPointer];

      if (IsEH) {
        // The address size is encoded in the CIE we reference.
        if (!Cie)
          ReportError(StartOffset, "Parsing FDE data at %" PRIx64
                                   " failed due to missing CIE");

        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(),
                EHFrameAddress ? EHFrameAddress + Offset : 0)) {
          InitialLocation = *Val;
        }
        if (auto Val = Data.getEncodedPointer(
                &Offset, Cie->getFDEPointerEncoding(), 0)) {
          AddressRange = *Val;
        }

        StringRef AugmentationString = Cie->getAugmentationString();
        if (!AugmentationString.empty()) {
          // Parse the augmentation length and data for this FDE.
          uint64_t AugmentationLength = Data.getULEB128(&Offset);

          uint64_t EndAugmentationOffset = Offset + AugmentationLength;

          // Decode the LSDA if the CIE augmentation string said we should.
          if (Cie->getLSDAPointerEncoding() != DW_EH_PE_omit) {
            LSDAAddress = Data.getEncodedPointer(
                &Offset, Cie->getLSDAPointerEncoding(),
                EHFrameAddress ? Offset + EHFrameAddress : 0);
          }

          if (Offset != EndAugmentationOffset)
            ReportError(StartOffset,
                        "Parsing augmentation data at %" PRIx64 " failed");
        }
      } else {
        InitialLocation = Data.getRelocatedAddress(&Offset);
        AddressRange = Data.getRelocatedAddress(&Offset);
      }

      Entries.emplace_back(new FDE(StartOffset, Length, CIEPointer,
                                   InitialLocation, AddressRange,
                                   Cie, LSDAAddress, Arch));
    }

    if (Error E =
            Entries.back()->cfis().parse(Data, &Offset, EndStructureOffset)) {
      report_fatal_error(toString(std::move(E)));
    }

    if (Offset != EndStructureOffset)
      ReportError(StartOffset,
                  "Parsing entry instructions at %" PRIx64 " failed");
  }
}